

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demo_CH_archive.cpp
# Opt level: O2

void __thiscall
myEmployeeCustomConstructor::myEmployeeCustomConstructor
          (myEmployeeCustomConstructor *this,int m_kids,double m_latitude)

{
  allocator local_41;
  double local_40;
  string local_38;
  
  local_40 = m_latitude;
  std::__cxx11::string::string((string *)&local_38,"John",&local_41);
  myEmployee::myEmployee(&this->super_myEmployee,0x50,4000.0,ATHLETIC,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  (this->super_myEmployee)._vptr_myEmployee = (_func_int **)&PTR__myEmployee_00160770;
  this->latitude = local_40;
  this->kids = m_kids;
  this->legs = 2;
  return;
}

Assistant:

myEmployeeCustomConstructor(int m_kids, double m_latitude)
        : myEmployee(80, 4000), 
        latitude(m_latitude),
        kids(m_kids),
        legs (2) {}